

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

bool __thiscall CTransaction::ComputeHasWitness(CTransaction *this)

{
  pointer pCVar1;
  long lVar2;
  long lVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  long in_FS_OFFSET;
  
  pCVar6 = (this->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pCVar1 - (long)pCVar6;
  pCVar6 = pCVar6 + 2;
  for (lVar2 = lVar3 / 0x68 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if (pCVar6[-2].scriptWitness.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        pCVar6[-2].scriptWitness.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar5 = pCVar6 + -2;
      goto LAB_00645153;
    }
    if (pCVar6[-1].scriptWitness.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        pCVar6[-1].scriptWitness.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar5 = pCVar6 + -1;
      goto LAB_00645153;
    }
    pCVar5 = pCVar6;
    if ((pCVar6->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pCVar6->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00645153;
    if (pCVar6[1].scriptWitness.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        pCVar6[1].scriptWitness.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar5 = pCVar6 + 1;
      goto LAB_00645153;
    }
    pCVar6 = pCVar6 + 4;
    lVar3 = lVar3 + -0x1a0;
  }
  lVar3 = lVar3 / 0x68;
  pCVar4 = pCVar6 + -2;
  if (lVar3 != 1) {
    if (lVar3 == 3) {
      pCVar5 = pCVar4;
      if (pCVar6[-2].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          pCVar6[-2].scriptWitness.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00645153;
      pCVar4 = pCVar6 + -1;
    }
    else {
      pCVar5 = pCVar1;
      if (lVar3 != 2) goto LAB_00645153;
    }
    pCVar5 = pCVar4;
    if ((pCVar4->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pCVar4->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00645153;
    pCVar4 = pCVar4 + 1;
  }
  pCVar5 = pCVar4;
  if ((pCVar4->scriptWitness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pCVar4->scriptWitness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar5 = pCVar1;
  }
LAB_00645153:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return pCVar5 != pCVar1;
}

Assistant:

bool CTransaction::ComputeHasWitness() const
{
    return std::any_of(vin.begin(), vin.end(), [](const auto& input) {
        return !input.scriptWitness.IsNull();
    });
}